

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O2

void icu_63::initChineseCalZoneAstroCalc(void)

{
  SimpleTimeZone *this;
  size_t in_RSI;
  ConstChar16Ptr local_68;
  char16_t *local_60;
  UnicodeString local_50;
  
  this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,in_RSI);
  if (this == (SimpleTimeZone *)0x0) {
    gChineseCalendarZoneAstroCalc = (TimeZone *)0x0;
  }
  else {
    local_68.p_ = L"CHINA_ZONE";
    UnicodeString::UnicodeString(&local_50,'\x01',&local_68,-1);
    SimpleTimeZone::SimpleTimeZone(this,28800000,&local_50);
    gChineseCalendarZoneAstroCalc = (TimeZone *)this;
    UnicodeString::~UnicodeString(&local_50);
    local_60 = local_68.p_;
  }
  ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initChineseCalZoneAstroCalc() {
    gChineseCalendarZoneAstroCalc = new SimpleTimeZone(CHINA_OFFSET, UNICODE_STRING_SIMPLE("CHINA_ZONE") );
    ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
}